

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sid.cc
# Opt level: O0

int __thiscall SID::output(SID *this,int bits)

{
  int iVar1;
  int iVar2;
  sound_sample sVar3;
  byte in_SIL;
  long in_RDI;
  int sample;
  int half;
  int range;
  int local_4;
  
  iVar1 = 1 << (in_SIL & 0x1f);
  iVar2 = iVar1 >> 1;
  sVar3 = ExternalFilter::output((ExternalFilter *)(in_RDI + 0x4208));
  local_4 = sVar3 / (int)(0xb340c / (long)iVar1);
  if (local_4 < iVar2) {
    if (SBORROW4(local_4,-iVar2) != local_4 + iVar2 < 0) {
      local_4 = -iVar2;
    }
  }
  else {
    local_4 = iVar2 + -1;
  }
  return local_4;
}

Assistant:

int SID::output(int bits)
{
  const int range = 1 << bits;
  const int half = range >> 1;
  int sample = extfilt.output()/((4095*255 >> 7)*3*15*2/range);
  if (sample >= half) {
    return half - 1;
  }
  if (sample < -half) {
    return -half;
  }
  return sample;
}